

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

double luby(double y,int x)

{
  int seq;
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar1 = 0;
  for (iVar2 = 1; iVar2 <= x; iVar2 = iVar2 * 2 + 1) {
    iVar1 = iVar1 + 1;
  }
  for (; iVar2 + -1 != x; x = x % iVar2) {
    iVar2 = iVar2 + -1 >> 1;
    iVar1 = iVar1 + -1;
  }
  dVar3 = pow(y,(double)iVar1);
  return dVar3;
}

Assistant:

double luby(double y, int x)
{
    int size, seq;
    for (size = 1, seq = 0; size < x+1; seq++, size = 2*size + 1);
    while (size-1 != x){
        size = (size-1) >> 1;
        seq--;
        x = x % size;
    }
    return pow(y, (double)seq);
}